

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetwork
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Status SVar2;
  size_type sVar3;
  const_reference pvVar4;
  element_type *peVar5;
  element_type *peVar6;
  Value *pVVar7;
  reference pvVar8;
  element_type *peVar9;
  reference this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_15c8;
  anon_class_1_0_00000001 local_14a2;
  v10 local_14a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_14a0;
  char *local_1498;
  string local_1490;
  Error local_1470;
  Value local_1448;
  string_t local_1400;
  Value local_13e0;
  string local_1398;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1378;
  anon_class_1_0_00000001 local_1362;
  v10 local_1361;
  v10 *local_1360;
  size_t local_1358;
  string local_1350;
  Error local_1330;
  Value local_1308;
  allocator local_12b9;
  string local_12b8;
  Value local_1298;
  anon_class_1_0_00000001 local_124a;
  v10 local_1249;
  v10 *local_1248;
  size_t local_1240;
  string local_1238;
  Error local_1218;
  Value local_11f0;
  anon_class_1_0_00000001 local_11a2;
  v10 local_11a1;
  v10 *local_11a0;
  size_t local_1198;
  string local_1190;
  Error local_1170;
  Value local_1148;
  undefined1 local_1100 [8];
  string nwkData;
  Network nwk;
  json json_1;
  string local_1068;
  ErrorCode local_1044;
  Error local_1040;
  int local_1018;
  anon_class_1_0_00000001 local_1012;
  v10 local_1011;
  v10 *local_1010;
  size_t local_1008;
  string local_1000;
  Error local_fe0;
  Value local_fb8;
  size_type local_f70;
  anon_class_1_0_00000001 local_f62;
  v10 local_f61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f60;
  char *local_f58;
  string local_f50;
  Error local_f30;
  Value local_f08;
  anon_class_1_0_00000001 local_eba;
  v10 local_eb9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_eb8;
  char *local_eb0;
  string local_ea8;
  Error local_e88;
  Value local_e60;
  undefined1 local_e18 [8];
  StringArray unresolved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  iterator local_db8;
  size_type local_db0;
  undefined1 local_da8 [8];
  StringArray aliases;
  v10 *local_d88;
  size_t local_d80;
  string local_d78;
  Error local_d58;
  Value local_d30;
  Status local_ce2;
  allocator local_ce1;
  undefined1 local_ce0 [6];
  RegistryStatus status;
  anon_class_1_0_00000001 local_cba;
  v10 local_cb9;
  v10 *local_cb8;
  size_t local_cb0;
  string local_ca8;
  Error local_c88;
  Value local_c60;
  undefined1 local_c18 [8];
  json json;
  string local_c00;
  ErrorCode local_bdc;
  Value local_bd8;
  allocator local_b89;
  string local_b88;
  ErrorCode local_b64;
  Error local_b60;
  Value local_b38;
  ErrorCode local_aec;
  Error local_ae8;
  Value local_ac0;
  allocator local_a71;
  string local_a70;
  ErrorCode local_a4c;
  Error local_a48;
  Value local_a20;
  ErrorCode local_9d4;
  Error local_9d0;
  Value local_9a8;
  anon_class_1_0_00000001 local_95a;
  v10 local_959;
  v10 *local_958;
  size_t local_950;
  string local_948;
  Error local_928;
  Value local_900;
  allocator local_8b1;
  string local_8b0;
  anon_class_1_0_00000001 local_87a;
  v10 local_879;
  v10 *local_878;
  size_t local_870;
  string local_868;
  Error local_848;
  Value local_820;
  undefined1 local_7d8 [8];
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_790 [16];
  v10 *local_780;
  ulong local_778;
  v10 *local_770;
  size_t sStack_768;
  string *local_760;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_758 [3];
  undefined1 local_740 [16];
  v10 *local_730;
  ulong local_728;
  v10 *local_720;
  size_t sStack_718;
  string *local_710;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_708 [3];
  undefined1 local_6f0 [16];
  v10 *local_6e0;
  ulong local_6d8;
  v10 *local_6d0;
  size_t sStack_6c8;
  string *local_6c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6b8 [3];
  undefined1 local_6a0 [16];
  v10 *local_690;
  ulong local_688;
  v10 *local_680;
  size_t sStack_678;
  string *local_670;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_668 [3];
  undefined1 local_650 [16];
  v10 *local_640;
  ulong local_638;
  v10 *local_630;
  size_t sStack_628;
  string *local_620;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_618 [3];
  undefined1 local_600 [16];
  v10 *local_5f0;
  ulong local_5e8;
  v10 *local_5e0;
  size_t sStack_5d8;
  string *local_5d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5c8 [3];
  undefined1 local_5b0 [16];
  v10 *local_5a0;
  ulong local_598;
  v10 *local_590;
  size_t sStack_588;
  string *local_580;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_578 [3];
  undefined1 local_560 [16];
  v10 *local_550;
  ulong local_548;
  v10 *local_540;
  size_t sStack_538;
  string *local_530;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_528 [2];
  undefined1 local_518 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  char *local_500;
  const_reference local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  char *pcStack_4e8;
  string *local_4e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4d8 [2];
  undefined1 local_4c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  char *local_4b0;
  const_reference local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a0;
  char *pcStack_498;
  string *local_490;
  v10 *local_488;
  v10 **local_480;
  v10 *local_478;
  v10 **local_470;
  v10 *local_468;
  v10 **local_460;
  v10 *local_458;
  v10 **local_450;
  v10 *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_440;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  undefined1 local_418 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  char *local_400;
  const_reference local_3f8;
  v10 *local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  char *pcStack_3e0;
  string *local_3d8;
  v10 *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3c8;
  v10 *local_3c0;
  v10 **local_3b8;
  v10 *local_3b0;
  v10 **local_3a8;
  v10 *local_3a0;
  v10 **local_398;
  v10 *local_390;
  v10 **local_388;
  v10 *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_378;
  v10 **local_370;
  v10 *local_368;
  size_t sStack_360;
  v10 **local_350;
  v10 *local_348;
  size_t sStack_340;
  v10 **local_330;
  v10 *local_328;
  size_t sStack_320;
  v10 **local_310;
  v10 *local_308;
  size_t sStack_300;
  v10 **local_2f0;
  v10 *local_2e8;
  size_t sStack_2e0;
  v10 **local_2d0;
  v10 *local_2c8;
  size_t sStack_2c0;
  v10 **local_2b0;
  v10 *local_2a8;
  size_t sStack_2a0;
  v10 **local_290;
  v10 *local_288;
  size_t sStack_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_270;
  undefined1 *local_268;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_260;
  undefined1 *local_258;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_250;
  undefined1 *local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_240;
  undefined1 *local_238;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_230;
  undefined1 *local_228;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_220;
  undefined1 *local_218;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_210;
  undefined1 *local_208;
  Value **local_200;
  undefined1 *local_1f8;
  Value **local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1b8;
  Value **local_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_198;
  undefined8 local_190;
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_180;
  undefined8 local_178;
  undefined1 *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_168;
  undefined8 local_160;
  undefined1 *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_150;
  undefined8 local_148;
  undefined1 *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_138;
  undefined8 local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  undefined8 local_118;
  undefined1 *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *pcStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char *pcStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_78;
  undefined8 local_70;
  undefined1 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_7d8,(nullptr_t)0x0);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aExpr);
  if (sVar3 < 2) {
    ProcessNetwork::anon_class_1_0_00000001::operator()(&local_87a);
    local_480 = &local_878;
    local_488 = &local_879;
    bVar10 = ::fmt::v10::operator()(local_488);
    local_870 = bVar10.size_;
    local_878 = (v10 *)bVar10.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_530 = &local_868;
    local_540 = local_878;
    sStack_538 = local_870;
    local_370 = &local_540;
    local_550 = local_878;
    local_548 = local_870;
    local_368 = local_550;
    sStack_360 = local_548;
    local_578[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_268 = local_560;
    local_270 = local_578;
    local_100 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_548;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_270;
    local_1b8 = local_270;
    local_108 = local_270;
    local_f8 = local_268;
    ::fmt::v10::vformat_abi_cxx11_(&local_868,local_550,fmt,args);
    Error::Error(&local_848,kInvalidArgs,&local_868);
    Value::Value(&local_820,&local_848);
    Value::operator=(__return_storage_ptr__,&local_820);
    Value::~Value(&local_820);
    Error::~Error(&local_848);
    std::__cxx11::string::~string((string *)&local_868);
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](aExpr,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8b0,"save",&local_8b1);
    bVar1 = CaseInsensitiveEqual(pvVar4,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    if (bVar1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(aExpr);
      if (sVar3 < 3) {
        ProcessNetwork::anon_class_1_0_00000001::operator()(&local_95a);
        local_470 = &local_958;
        local_478 = &local_959;
        bVar10 = ::fmt::v10::operator()(local_478);
        local_950 = bVar10.size_;
        local_958 = (v10 *)bVar10.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_580 = &local_948;
        local_590 = local_958;
        sStack_588 = local_950;
        local_350 = &local_590;
        local_5a0 = local_958;
        local_598 = local_950;
        local_348 = local_5a0;
        sStack_340 = local_598;
        local_5c8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_258 = local_5b0;
        local_260 = local_5c8;
        local_118 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_598;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_260;
        local_1c0 = local_260;
        local_120 = local_260;
        local_110 = local_258;
        ::fmt::v10::vformat_abi_cxx11_(&local_948,local_5a0,fmt_00,args_00);
        Error::Error(&local_928,kInvalidArgs,&local_948);
        Value::Value(&local_900,&local_928);
        Value::operator=(__return_storage_ptr__,&local_900);
        Value::~Value(&local_900);
        Error::~Error(&local_928);
        std::__cxx11::string::~string((string *)&local_948);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mJobManager);
        JobManager::GetSelectedCommissioner(&local_9d0,peVar5,(CommissionerAppPtr *)local_7d8);
        Value::Value(&local_9a8,&local_9d0);
        pVVar7 = Value::operator=(__return_storage_ptr__,&local_9a8);
        local_9d4 = kNone;
        bVar1 = Value::operator!=(pVVar7,&local_9d4);
        Value::~Value(&local_9a8);
        Error::~Error(&local_9d0);
        if (!bVar1) {
          peVar6 = std::
                   __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_7d8);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,2);
          (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x10])
                    (&local_a48,peVar6,pvVar4);
          Value::Value(&local_a20,&local_a48);
          pVVar7 = Value::operator=(__return_storage_ptr__,&local_a20);
          local_a4c = kNone;
          Value::operator!=(pVVar7,&local_a4c);
          Value::~Value(&local_a20);
          Error::~Error(&local_a48);
        }
      }
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a70,"sync",&local_a71);
      bVar1 = CaseInsensitiveEqual(pvVar4,&local_a70);
      std::__cxx11::string::~string((string *)&local_a70);
      std::allocator<char>::~allocator((allocator<char> *)&local_a71);
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mJobManager);
        JobManager::GetSelectedCommissioner(&local_ae8,peVar5,(CommissionerAppPtr *)local_7d8);
        Value::Value(&local_ac0,&local_ae8);
        pVVar7 = Value::operator=(__return_storage_ptr__,&local_ac0);
        local_aec = kNone;
        bVar1 = Value::operator!=(pVVar7,&local_aec);
        Value::~Value(&local_ac0);
        Error::~Error(&local_ae8);
        if (!bVar1) {
          peVar6 = std::
                   __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_7d8);
          (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x11])(&local_b60);
          Value::Value(&local_b38,&local_b60);
          pVVar7 = Value::operator=(__return_storage_ptr__,&local_b38);
          local_b64 = kNone;
          Value::operator!=(pVVar7,&local_b64);
          Value::~Value(&local_b38);
          Error::~Error(&local_b60);
        }
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b88,"list",&local_b89);
        bVar1 = CaseInsensitiveEqual(pvVar4,&local_b88);
        std::__cxx11::string::~string((string *)&local_b88);
        std::allocator<char>::~allocator((allocator<char> *)&local_b89);
        if (bVar1) {
          ProcessNetworkList(&local_bd8,this,aExpr);
          pVVar7 = Value::operator=(__return_storage_ptr__,&local_bd8);
          local_bdc = kNone;
          Value::operator!=(pVVar7,&local_bdc);
          Value::~Value(&local_bd8);
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_c00,"select",(allocator *)((long)&json.m_value + 7));
          bVar1 = CaseInsensitiveEqual(pvVar4,&local_c00);
          std::__cxx11::string::~string((string *)&local_c00);
          std::allocator<char>::~allocator((allocator<char> *)((long)&json.m_value + 7));
          if (bVar1) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_c18,(nullptr_t)0x0);
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(aExpr);
            if (sVar3 == 3) {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,2);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)local_ce0,"none",&local_ce1);
              bVar1 = CaseInsensitiveEqual(pvVar4,(string *)local_ce0);
              std::__cxx11::string::~string((string *)local_ce0);
              std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
              if (bVar1) {
                peVar9 = std::
                         __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&this->mRegistry);
                local_ce2 = persistent_storage::Registry::ForgetCurrentNetwork(peVar9);
                if (local_ce2 == kSuccess) goto LAB_00248326;
                ProcessNetwork::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           ((long)&aliases.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
                local_450 = &local_d88;
                local_458 = (v10 *)((long)&aliases.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                bVar10 = ::fmt::v10::operator()(local_458);
                local_d80 = bVar10.size_;
                local_d88 = (v10 *)bVar10.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_620 = &local_d78;
                local_630 = local_d88;
                sStack_628 = local_d80;
                local_310 = &local_630;
                local_640 = local_d88;
                local_638 = local_d80;
                local_308 = local_640;
                sStack_300 = local_638;
                local_668[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_238 = local_650;
                local_240 = local_668;
                local_148 = 0;
                fmt_02.size_ = 0;
                fmt_02.data_ = (char *)local_638;
                args_02.field_1.values_ = in_R9.values_;
                args_02.desc_ = (unsigned_long_long)local_240;
                local_1d0 = local_240;
                local_150 = local_240;
                local_140 = local_238;
                ::fmt::v10::vformat_abi_cxx11_(&local_d78,local_640,fmt_02,args_02);
                Error::Error(&local_d58,kRegistryError,&local_d78);
                Value::Value(&local_d30,&local_d58);
                Value::operator=(__return_storage_ptr__,&local_d30);
                Value::~Value(&local_d30);
                Error::~Error(&local_d58);
                std::__cxx11::string::~string((string *)&local_d78);
                local_1018 = 4;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](aExpr,2);
                std::__cxx11::string::string((string *)&local_dd8,(string *)pvVar4);
                local_db8 = &local_dd8;
                local_db0 = 1;
                this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&xpans.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator(this_00);
                __l._M_len = local_db0;
                __l._M_array = local_db8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_da8,__l,this_00);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)((long)&xpans.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                local_15c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_db8;
                do {
                  local_15c8 = local_15c8 + -1;
                  std::__cxx11::string::~string((string *)local_15c8);
                } while (local_15c8 != &local_dd8);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &unresolved.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_e18);
                peVar9 = std::
                         __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&this->mRegistry);
                SVar2 = persistent_storage::Registry::GetNetworkXpansByAliases
                                  (peVar9,(StringArray *)local_da8,
                                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &unresolved.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (StringArray *)local_e18);
                if (SVar2 == kSuccess) {
                  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &unresolved.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar3 == 1) {
                    peVar9 = std::
                             __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&this->mRegistry);
                    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                        &unresolved.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                    SVar2 = persistent_storage::Registry::SetCurrentNetwork(peVar9,*pvVar8);
                    if (SVar2 == kSuccess) {
                      local_1018 = 0;
                    }
                    else {
                      ProcessNetwork::anon_class_1_0_00000001::operator()(&local_1012);
                      local_3b8 = &local_1010;
                      local_3c0 = &local_1011;
                      bVar10 = ::fmt::v10::operator()(local_3c0);
                      local_1008 = bVar10.size_;
                      local_1010 = (v10 *)bVar10.data_;
                      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                      local_670 = &local_1000;
                      local_680 = local_1010;
                      sStack_678 = local_1008;
                      local_2f0 = &local_680;
                      local_690 = local_1010;
                      local_688 = local_1008;
                      local_2e8 = local_690;
                      sStack_2e0 = local_688;
                      local_6b8[0] = ::fmt::v10::
                                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                               ();
                      local_228 = local_6a0;
                      local_230 = local_6b8;
                      local_160 = 0;
                      fmt_05.size_ = 0;
                      fmt_05.data_ = (char *)local_688;
                      args_05.field_1.values_ = in_R9.values_;
                      args_05.desc_ = (unsigned_long_long)local_230;
                      local_1d8 = local_230;
                      local_168 = local_230;
                      local_158 = local_228;
                      ::fmt::v10::vformat_abi_cxx11_(&local_1000,local_690,fmt_05,args_05);
                      Error::Error(&local_fe0,kRegistryError,&local_1000);
                      Value::Value(&local_fb8,&local_fe0);
                      Value::operator=(__return_storage_ptr__,&local_fb8);
                      Value::~Value(&local_fb8);
                      Error::~Error(&local_fe0);
                      std::__cxx11::string::~string((string *)&local_1000);
                      local_1018 = 4;
                    }
                  }
                  else {
                    ProcessNetwork::anon_class_1_0_00000001::operator()(&local_f62);
                    local_3c8 = &local_f60;
                    local_3d0 = &local_f61;
                    bVar10 = ::fmt::v10::operator()(local_3d0);
                    local_f58 = (char *)bVar10.size_;
                    local_f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )bVar10.data_;
                    ::fmt::v10::detail::
                    check_format_string<unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                              ();
                    local_f70 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &unresolved.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    local_3f8 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](aExpr,2);
                    local_3d8 = &local_f50;
                    local_3e8 = local_f60;
                    pcStack_3e0 = local_f58;
                    local_3f0 = (v10 *)&local_f70;
                    local_50 = &local_3e8;
                    local_408 = local_f60;
                    local_400 = local_f58;
                    local_48 = local_408;
                    pcStack_40 = local_400;
                    ::fmt::v10::
                    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,std::__cxx11::string_const>
                              (&local_438,local_3f0,(unsigned_long *)local_3f8,local_f60);
                    local_30 = local_418;
                    local_38 = &local_438;
                    local_20 = 0xd4;
                    fmt_04.size_ = 0xd4;
                    fmt_04.data_ = local_400;
                    args_04.field_1.values_ = in_R9.values_;
                    args_04.desc_ = (unsigned_long_long)local_38;
                    local_28 = local_38;
                    local_18 = local_30;
                    local_10 = local_38;
                    ::fmt::v10::vformat_abi_cxx11_(&local_f50,(v10 *)local_408,fmt_04,args_04);
                    Error::Error(&local_f30,kIOError,&local_f50);
                    Value::Value(&local_f08,&local_f30);
                    Value::operator=(__return_storage_ptr__,&local_f08);
                    Value::~Value(&local_f08);
                    Error::~Error(&local_f30);
                    std::__cxx11::string::~string((string *)&local_f50);
                    local_1018 = 4;
                  }
                }
                else {
                  ProcessNetwork::anon_class_1_0_00000001::operator()(&local_eba);
                  local_440 = &local_eb8;
                  local_448 = &local_eb9;
                  bVar10 = ::fmt::v10::operator()(local_448);
                  local_eb0 = (char *)bVar10.size_;
                  local_eb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              bVar10.data_;
                  ::fmt::v10::detail::
                  check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  local_4a8 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](aExpr,2);
                  local_490 = &local_ea8;
                  local_4a0 = local_eb8;
                  pcStack_498 = local_eb0;
                  local_f0 = &local_4a0;
                  local_4b8 = local_eb8;
                  local_4b0 = local_eb0;
                  local_e8 = local_4b8;
                  pcStack_e0 = local_4b0;
                  local_4d8[0] = ::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)local_4a8,(v10 *)local_490,local_eb8);
                  local_a8 = local_4c8;
                  local_b0 = local_4d8;
                  local_98 = 0xd;
                  fmt_03.size_ = 0xd;
                  fmt_03.data_ = local_4b0;
                  args_03.field_1.values_ = in_R9.values_;
                  args_03.desc_ = (unsigned_long_long)local_b0;
                  local_a0 = local_b0;
                  local_90 = local_a8;
                  local_58 = local_b0;
                  ::fmt::v10::vformat_abi_cxx11_(&local_ea8,(v10 *)local_4b8,fmt_03,args_03);
                  Error::Error(&local_e88,kRegistryError,&local_ea8);
                  Value::Value(&local_e60,&local_e88);
                  Value::operator=(__return_storage_ptr__,&local_e60);
                  Value::~Value(&local_e60);
                  Error::~Error(&local_e88);
                  std::__cxx11::string::~string((string *)&local_ea8);
                  local_1018 = 4;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_e18);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &unresolved.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_da8);
                if (local_1018 == 0) {
LAB_00248326:
                  UpdateNetworkSelectionInfo(&local_1040,this,false);
                  local_1044 = kNone;
                  bVar1 = commissioner::operator!=(&local_1040,&local_1044);
                  Error::~Error(&local_1040);
                  if (bVar1) {
                    local_1018 = 4;
                  }
                  else {
                    local_1018 = 0;
                  }
                }
              }
            }
            else {
              ProcessNetwork::anon_class_1_0_00000001::operator()(&local_cba);
              local_460 = &local_cb8;
              local_468 = &local_cb9;
              bVar10 = ::fmt::v10::operator()(local_468);
              local_cb0 = bVar10.size_;
              local_cb8 = (v10 *)bVar10.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_5d0 = &local_ca8;
              local_5e0 = local_cb8;
              sStack_5d8 = local_cb0;
              local_330 = &local_5e0;
              local_5f0 = local_cb8;
              local_5e8 = local_cb0;
              local_328 = local_5f0;
              sStack_320 = local_5e8;
              local_618[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_248 = local_600;
              local_250 = local_618;
              local_130 = 0;
              fmt_01.size_ = 0;
              fmt_01.data_ = (char *)local_5e8;
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)local_250;
              local_1c8 = local_250;
              local_138 = local_250;
              local_128 = local_248;
              ::fmt::v10::vformat_abi_cxx11_(&local_ca8,local_5f0,fmt_01,args_01);
              Error::Error(&local_c88,kInvalidArgs,&local_ca8);
              Value::Value(&local_c60,&local_c88);
              Value::operator=(__return_storage_ptr__,&local_c60);
              Value::~Value(&local_c60);
              Error::~Error(&local_c88);
              std::__cxx11::string::~string((string *)&local_ca8);
              local_1018 = 4;
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_c18);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1068,"identify",(allocator *)((long)&json_1.m_value + 7));
            bVar1 = CaseInsensitiveEqual(pvVar4,&local_1068);
            std::__cxx11::string::~string((string *)&local_1068);
            std::allocator<char>::~allocator((allocator<char> *)((long)&json_1.m_value + 7));
            if (!bVar1) {
              ProcessNetwork::anon_class_1_0_00000001::operator()(&local_14a2);
              local_378 = &local_14a0;
              local_380 = &local_14a1;
              bVar10 = ::fmt::v10::operator()(local_380);
              local_1498 = (char *)bVar10.size_;
              local_14a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           bVar10.data_;
              ::fmt::v10::detail::
              check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_4f8 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](aExpr,1);
              local_4e0 = &local_1490;
              local_4f0 = local_14a0;
              pcStack_4e8 = local_1498;
              local_d0 = &local_4f0;
              local_508 = local_14a0;
              local_500 = local_1498;
              local_c8 = local_508;
              pcStack_c0 = local_500;
              local_528[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_4f8,(v10 *)local_4e0,local_14a0);
              local_80 = local_518;
              local_88 = local_528;
              local_70 = 0xd;
              fmt_09.size_ = 0xd;
              fmt_09.data_ = local_500;
              args_09.field_1.values_ = in_R9.values_;
              args_09.desc_ = (unsigned_long_long)local_88;
              local_78 = local_88;
              local_68 = local_80;
              local_60 = local_88;
              ::fmt::v10::vformat_abi_cxx11_(&local_1490,(v10 *)local_508,fmt_09,args_09);
              Error::Error(&local_1470,kInvalidCommand,&local_1490);
              Value::Value(&local_1448,&local_1470);
              Value::operator=(__return_storage_ptr__,&local_1448);
              Value::~Value(&local_1448);
              Error::~Error(&local_1470);
              std::__cxx11::string::~string((string *)&local_1490);
              goto LAB_002491ad;
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)&nwk.mCcm,(nullptr_t)0x0);
            persistent_storage::Network::Network((Network *)((long)&nwkData.field_2 + 8));
            std::__cxx11::string::string((string *)local_1100);
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(aExpr);
            if (sVar3 == 2) {
              peVar9 = std::
                       __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mRegistry);
              SVar2 = persistent_storage::Registry::GetCurrentNetwork
                                (peVar9,(Network *)((long)&nwkData.field_2 + 8));
              if (SVar2 == kSuccess) {
                if (nwkData.field_2._8_4_ == -1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_12b8,"none",&local_12b9);
                  Value::Value(&local_1298,&local_12b8);
                  Value::operator=(__return_storage_ptr__,&local_1298);
                  Value::~Value(&local_1298);
                  std::__cxx11::string::~string((string *)&local_12b8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_12b9);
                }
                else {
                  if (nwkData.field_2._12_4_ != -1) {
                    peVar9 = std::
                             __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&this->mRegistry);
                    SVar2 = persistent_storage::Registry::GetDomainNameByXpan
                                      (peVar9,nwk.mName.field_2._8_8_,(string *)local_1100);
                    if (SVar2 != kSuccess) {
                      ProcessNetwork::anon_class_1_0_00000001::operator()(&local_1362);
                      local_388 = &local_1360;
                      local_390 = &local_1361;
                      bVar10 = ::fmt::v10::operator()(local_390);
                      local_1358 = bVar10.size_;
                      local_1360 = (v10 *)bVar10.data_;
                      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                      local_760 = &local_1350;
                      local_770 = local_1360;
                      sStack_768 = local_1358;
                      local_290 = &local_770;
                      local_780 = local_1360;
                      local_778 = local_1358;
                      local_288 = local_780;
                      sStack_280 = local_778;
                      value = (Value *)::fmt::v10::
                                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                                 ();
                      local_1f8 = local_790;
                      local_200 = &value;
                      local_1a8 = 0;
                      fmt_08.size_ = 0;
                      fmt_08.data_ = (char *)local_778;
                      args_08.field_1.values_ = in_R9.values_;
                      args_08.desc_ = (unsigned_long_long)local_200;
                      local_1f0 = local_200;
                      local_1b0 = local_200;
                      local_1a0 = local_1f8;
                      ::fmt::v10::vformat_abi_cxx11_(&local_1350,local_780,fmt_08,args_08);
                      Error::Error(&local_1330,kNotFound,&local_1350);
                      Value::Value(&local_1308,&local_1330);
                      Value::operator=(__return_storage_ptr__,&local_1308);
                      Value::~Value(&local_1308);
                      Error::~Error(&local_1330);
                      std::__cxx11::string::~string((string *)&local_1350);
                      local_1018 = 4;
                      goto LAB_00248ef9;
                    }
                    std::__cxx11::string::operator+=((string *)local_1100,'/');
                  }
                  std::__cxx11::string::operator+=((string *)local_1100,(string *)&nwk);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::
                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_1378,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1100);
                  utils::Hex<unsigned_long>(&local_1398,nwk.mName.field_2._8_8_);
                  this_01 = nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                          *)&nwk.mCcm,&local_1398);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator=(this_01,&local_1378);
                  std::__cxx11::string::~string((string *)&local_1398);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::~basic_json(&local_1378);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::dump(&local_1400,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)&nwk.mCcm,4,' ',false,strict);
                  Value::Value(&local_13e0,&local_1400);
                  Value::operator=(__return_storage_ptr__,&local_13e0);
                  Value::~Value(&local_13e0);
                  std::__cxx11::string::~string((string *)&local_1400);
                }
                local_1018 = 0;
              }
              else {
                ProcessNetwork::anon_class_1_0_00000001::operator()(&local_124a);
                local_398 = &local_1248;
                local_3a0 = &local_1249;
                bVar10 = ::fmt::v10::operator()(local_3a0);
                local_1240 = bVar10.size_;
                local_1248 = (v10 *)bVar10.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_710 = &local_1238;
                local_720 = local_1248;
                sStack_718 = local_1240;
                local_2b0 = &local_720;
                local_730 = local_1248;
                local_728 = local_1240;
                local_2a8 = local_730;
                sStack_2a0 = local_728;
                local_758[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_208 = local_740;
                local_210 = local_758;
                local_190 = 0;
                fmt_07.size_ = 0;
                fmt_07.data_ = (char *)local_728;
                args_07.field_1.values_ = in_R9.values_;
                args_07.desc_ = (unsigned_long_long)local_210;
                local_1e8 = local_210;
                local_198 = local_210;
                local_188 = local_208;
                ::fmt::v10::vformat_abi_cxx11_(&local_1238,local_730,fmt_07,args_07);
                Error::Error(&local_1218,kRegistryError,&local_1238);
                Value::Value(&local_11f0,&local_1218);
                Value::operator=(__return_storage_ptr__,&local_11f0);
                Value::~Value(&local_11f0);
                Error::~Error(&local_1218);
                std::__cxx11::string::~string((string *)&local_1238);
                local_1018 = 4;
              }
            }
            else {
              ProcessNetwork::anon_class_1_0_00000001::operator()(&local_11a2);
              local_3a8 = &local_11a0;
              local_3b0 = &local_11a1;
              bVar10 = ::fmt::v10::operator()(local_3b0);
              local_1198 = bVar10.size_;
              local_11a0 = (v10 *)bVar10.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_6c0 = &local_1190;
              local_6d0 = local_11a0;
              sStack_6c8 = local_1198;
              local_2d0 = &local_6d0;
              local_6e0 = local_11a0;
              local_6d8 = local_1198;
              local_2c8 = local_6e0;
              sStack_2c0 = local_6d8;
              local_708[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_218 = local_6f0;
              local_220 = local_708;
              local_178 = 0;
              fmt_06.size_ = 0;
              fmt_06.data_ = (char *)local_6d8;
              args_06.field_1.values_ = in_R9.values_;
              args_06.desc_ = (unsigned_long_long)local_220;
              local_1e0 = local_220;
              local_180 = local_220;
              local_170 = local_218;
              ::fmt::v10::vformat_abi_cxx11_(&local_1190,local_6e0,fmt_06,args_06);
              Error::Error(&local_1170,kInvalidArgs,&local_1190);
              Value::Value(&local_1148,&local_1170);
              Value::operator=(__return_storage_ptr__,&local_1148);
              Value::~Value(&local_1148);
              Error::~Error(&local_1170);
              std::__cxx11::string::~string((string *)&local_1190);
              local_1018 = 4;
            }
LAB_00248ef9:
            std::__cxx11::string::~string((string *)local_1100);
            persistent_storage::Network::~Network((Network *)((long)&nwkData.field_2 + 8));
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)&nwk.mCcm);
          }
          if ((local_1018 != 0) && (local_1018 != 4)) goto LAB_002491be;
        }
      }
    }
  }
LAB_002491ad:
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  local_1018 = 1;
LAB_002491be:
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_7d8);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetwork(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "save"))
    {
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = commissioner->SaveNetworkData(aExpr[2]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "sync"))
    {
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = commissioner->SyncNetworkData());
    }
    else if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        SuccessOrExit(value = ProcessNetworkList(aExpr));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "select"))
    {
        ::nlohmann::json json;

        VerifyOrExit(aExpr.size() == 3, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        if (CaseInsensitiveEqual(aExpr[2], "none"))
        {
            RegistryStatus status = mRegistry->ForgetCurrentNetwork();
            VerifyOrExit(status == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("network unselection failed"));
        }
        else
        {
            StringArray           aliases = {aExpr[2]};
            std::vector<uint64_t> xpans;
            StringArray           unresolved;
            VerifyOrExit(mRegistry->GetNetworkXpansByAliases(aliases, xpans, unresolved) == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("Failed to resolve extended PAN Id for network '{}'", aExpr[2]));
            VerifyOrExit(xpans.size() == 1, value = ERROR_IO_ERROR("Detected {} networks instead of 1 for alias '{}'",
                                                                   xpans.size(), aExpr[2]));
            VerifyOrExit(mRegistry->SetCurrentNetwork(xpans[0]) == RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("network selection failed"));
        }
        // update console prompt after network selection/deselection
        SuccessOrExit(UpdateNetworkSelectionInfo());
    }
    else if (CaseInsensitiveEqual(aExpr[1], "identify"))
    {
        ::nlohmann::json json;
        Network          nwk;
        std::string      nwkData;

        VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        VerifyOrExit(mRegistry->GetCurrentNetwork(nwk) == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED));
        if (nwk.mId.mId == EMPTY_ID)
        {
            value = std::string("none");
        }
        else
        {
            if (nwk.mDomainId.mId != EMPTY_ID)
            {
                VerifyOrExit(mRegistry->GetDomainNameByXpan(nwk.mXpan, nwkData) == RegistryStatus::kSuccess,
                             value = ERROR_NOT_FOUND(NOT_FOUND_STR DOMAIN_STR));
                nwkData += '/';
            }
            nwkData += nwk.mName;
            json[utils::Hex(nwk.mXpan)] = nwkData;
            value                       = json.dump(JSON_INDENT_DEFAULT);
        }
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}